

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall kratos::PortBundleVisitor::visit(PortBundleVisitor *this,Generator *generator)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Rb_tree_node_base *p_Var3;
  vector<std::pair<std::__cxx11::string,kratos::Generator*>,std::allocator<std::pair<std::__cxx11::string,kratos::Generator*>>>
  *this_00;
  _Rb_tree_node_base *p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 local_80 [8];
  shared_ptr<kratos::Port> port;
  _Alloc_hider local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> port_name;
  int local_34;
  
  p_Var4 = (generator->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(generator->port_bundle_mapping_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      lVar2 = *(long *)(p_Var4 + 2);
      p_Var3 = *(_Rb_tree_node_base **)(lVar2 + 0xd8);
      if (p_Var3 != (_Rb_tree_node_base *)(lVar2 + 200)) {
        local_34 = 2;
        bVar5 = false;
        bVar7 = true;
        do {
          local_60._M_p = (pointer)&port_name._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffffffa0,*(long *)(p_Var3 + 2),
                     (long)&(p_Var3[2]._M_parent)->_M_color + *(long *)(p_Var3 + 2));
          Generator::get_port((Generator *)local_80,(string *)generator);
          if (bVar5) {
            bVar6 = false;
            bVar8 = false;
            if (local_34 == *(int *)((long)local_80 + 0x270)) goto LAB_00210b88;
          }
          else {
            bVar5 = true;
            local_34 = *(int *)((long)local_80 + 0x270);
LAB_00210b88:
            if (*(long *)((long)local_80 + 0xa8) - (long)*(uint **)((long)local_80 + 0xa0) == 4) {
              bVar8 = **(uint **)((long)local_80 + 0xa0) < 2;
              bVar6 = bVar7;
              if (!bVar8) {
                bVar6 = false;
              }
            }
            else {
              bVar8 = false;
              bVar6 = false;
            }
          }
          if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if ((size_type *)local_60._M_p != &port_name._M_string_length) {
            operator_delete(local_60._M_p,port_name._M_string_length + 1);
          }
        } while ((bVar8) &&
                (p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3), bVar7 = bVar6,
                p_Var3 != (_Rb_tree_node_base *)(lVar2 + 200)));
        if ((bVar6) && ((local_34 != 2 && (*(long *)(lVar2 + 0xe8) != 0)))) {
          local_80 = (undefined1  [8])
                     &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          lVar2 = *(long *)(*(long *)(p_Var4 + 2) + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_80,lVar2,*(long *)(*(long *)(p_Var4 + 2) + 0x18) + lVar2);
          this_00 = (vector<std::pair<std::__cxx11::string,kratos::Generator*>,std::allocator<std::pair<std::__cxx11::string,kratos::Generator*>>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
                       ::operator[](&this->bundle_mapping_,(key_type *)local_80);
          local_60._M_p = (pointer)&port_name._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffffffa0,*(long *)(p_Var4 + 1),
                     (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
          port_name.field_2._8_8_ = generator;
          std::
          vector<std::pair<std::__cxx11::string,kratos::Generator*>,std::allocator<std::pair<std::__cxx11::string,kratos::Generator*>>>
          ::emplace_back<std::pair<std::__cxx11::string,kratos::Generator*>>
                    (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>
                              *)&stack0xffffffffffffffa0);
          if ((size_type *)local_60._M_p != &port_name._M_string_length) {
            operator_delete(local_60._M_p,port_name._M_string_length + 1);
          }
          if (local_80 !=
              (undefined1  [8])
              &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
            operator_delete((void *)local_80,
                            (ulong)((long)&(port.
                                            super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
        }
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto const& mappings = generator->port_bundle_mapping();
        for (auto const& [entry_name, ref] : mappings) {
            const auto& mapping = ref->name_mappings();
            PortDirection dir = PortDirection::InOut;
            bool initialized = false;
            bool same_direction = true;
            for (auto const& iter : mapping) {
                auto port_name = iter.second;
                auto port = generator->get_port(port_name);
                // all the ports have to have the same direction
                if (!initialized) {
                    initialized = true;
                    dir = port->port_direction();
                } else {
                    if (dir != port->port_direction()) {
                        same_direction = false;
                        break;
                    }
                }
                if (port->size().size() != 1 || port->size().front() > 1) {
                    // TODO: upgrade packed struct to support array
                    same_direction = false;
                    break;
                }
            }
            if (same_direction && dir != PortDirection::InOut && !mapping.empty()) {
                // this is the one we need to convert
                auto bundle_name = ref->def_name();
                bundle_mapping_[bundle_name].emplace_back(std::make_pair(entry_name, generator));
            }
        }
    }